

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.cpp
# Opt level: O3

size_t duckdb_zstd::ZSTD_compressBlock_btlazy2_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  undefined8 *puVar1;
  ZSTD_matchState_t *pZVar2;
  int iVar3;
  undefined8 uVar4;
  seqStore_t *psVar5;
  uint uVar6;
  uint uVar7;
  U32 UVar8;
  size_t sVar9;
  ulong uVar10;
  seqDef *psVar11;
  U32 UVar12;
  BYTE *pBVar13;
  BYTE *pBVar14;
  uint uVar15;
  int *piVar16;
  long lVar17;
  int *piVar18;
  BYTE *litEnd;
  int *piVar19;
  ulong uVar20;
  ulong uVar21;
  BYTE *litEnd_1;
  U32 UVar22;
  BYTE *pBVar23;
  size_t offbaseFound;
  BYTE *litLimit_w;
  U32 local_c8;
  size_t local_c0;
  U32 local_b4;
  ZSTD_matchState_t *local_b0;
  BYTE *local_a8;
  ulong local_a0;
  int *local_98;
  ulong local_90;
  uint local_84;
  int *local_80;
  seqStore_t *local_78;
  BYTE *local_70;
  BYTE *local_68;
  BYTE *local_60;
  int *local_58;
  BYTE *local_50;
  BYTE *local_48;
  U32 *local_40;
  BYTE *local_38;
  
  pBVar23 = (BYTE *)((long)src + srcSize);
  local_80 = (int *)((long)src + (srcSize - 8));
  local_68 = (ms->window).base;
  local_84 = (ms->window).dictLimit;
  local_90 = (ulong)local_84;
  local_70 = local_68 + local_90;
  uVar6 = (ms->cParams).minMatch;
  uVar7 = 6;
  if (uVar6 < 6) {
    uVar7 = uVar6;
  }
  uVar6 = 4;
  if (4 < uVar7) {
    uVar6 = uVar7;
  }
  pZVar2 = ms->dictMatchState;
  local_60 = (pZVar2->window).nextSrc;
  local_50 = (pZVar2->window).base;
  local_38 = local_50 + (pZVar2->window).dictLimit;
  local_c8 = *rep;
  piVar18 = (int *)((ulong)(((int)src - ((int)local_38 + (int)local_70)) + (int)local_60 == 0) +
                   (long)src);
  local_b4 = rep[1];
  ms->lazySkipping = 0;
  local_40 = rep;
  if (piVar18 < local_80) {
    local_84 = ((int)local_50 - (int)local_60) + local_84;
    local_48 = local_50 + -(ulong)local_84;
    local_58 = (int *)(pBVar23 + -0x20);
    local_b0 = ms;
    local_a8 = pBVar23;
    local_78 = seqStore;
    do {
      local_98 = (int *)((long)piVar18 + 1);
      uVar7 = (((int)piVar18 - (int)local_68) - local_c8) + 1;
      uVar15 = (uint)local_90;
      piVar16 = (int *)(local_68 + uVar7);
      if (uVar7 < uVar15) {
        piVar16 = (int *)(local_50 + (uVar7 - local_84));
      }
      if ((uVar7 - uVar15 < 0xfffffffd) && (*piVar16 == *local_98)) {
        pBVar14 = pBVar23;
        if (uVar7 < uVar15) {
          pBVar14 = local_60;
        }
        sVar9 = ZSTD_count_2segments
                          ((BYTE *)((long)piVar18 + 5),(BYTE *)(piVar16 + 1),pBVar23,pBVar14,
                           local_70);
        uVar20 = sVar9 + 4;
      }
      else {
        uVar20 = 0;
      }
      pZVar2 = local_b0;
      local_c0 = 999999999;
      if (uVar6 == 6) {
        uVar10 = ZSTD_BtFindBestMatch_dictMatchState_6(local_b0,(BYTE *)piVar18,local_a8,&local_c0);
      }
      else if (uVar6 == 5) {
        uVar10 = ZSTD_BtFindBestMatch_dictMatchState_5(local_b0,(BYTE *)piVar18,local_a8,&local_c0);
      }
      else {
        uVar10 = ZSTD_BtFindBestMatch_dictMatchState_4(local_b0,(BYTE *)piVar18,local_a8,&local_c0);
      }
      uVar21 = uVar20;
      if (uVar20 < uVar10) {
        uVar21 = uVar10;
      }
      if (uVar21 < 4) {
        uVar20 = (long)piVar18 - (long)src;
        piVar18 = (int *)((long)piVar18 + (uVar20 >> 8) + 1);
        pZVar2->lazySkipping = (uint)(0x7ff < uVar20);
        pBVar23 = local_a8;
        UVar12 = local_b4;
      }
      else {
        piVar16 = piVar18;
        local_a0 = local_c0;
        if (uVar10 <= uVar20) {
          local_a0 = 1;
          piVar16 = local_98;
        }
        local_98 = piVar16;
        if (piVar18 < local_80) {
          do {
            pBVar23 = local_a8;
            piVar16 = (int *)((long)piVar18 + 1);
            uVar7 = ((int)piVar16 - (int)local_68) - local_c8;
            piVar19 = (int *)(local_68 + uVar7);
            if (uVar7 < (uint)local_90) {
              piVar19 = (int *)(local_50 + (uVar7 - local_84));
            }
            if ((uVar7 - (uint)local_90 < 0xfffffffd) && (*piVar19 == *piVar16)) {
              pBVar14 = local_a8;
              if (uVar7 < (uint)local_90) {
                pBVar14 = local_60;
              }
              sVar9 = ZSTD_count_2segments
                                ((BYTE *)((long)piVar18 + 5),(BYTE *)(piVar19 + 1),local_a8,pBVar14,
                                 local_70);
              if (sVar9 < 0xfffffffffffffffc) {
                uVar7 = 0x1f;
                if ((uint)local_a0 != 0) {
                  for (; (uint)local_a0 >> uVar7 == 0; uVar7 = uVar7 - 1) {
                  }
                }
                if ((int)((uVar7 ^ 0x1f) + (int)uVar21 * 3 + -0x1e) < (int)(sVar9 + 4) * 3) {
                  local_a0 = 1;
                  uVar21 = sVar9 + 4;
                  local_98 = piVar16;
                }
              }
            }
            local_c0 = 999999999;
            if (uVar6 == 6) {
              uVar20 = ZSTD_BtFindBestMatch_dictMatchState_6
                                 (local_b0,(BYTE *)piVar16,pBVar23,&local_c0);
            }
            else if (uVar6 == 5) {
              uVar20 = ZSTD_BtFindBestMatch_dictMatchState_5
                                 (local_b0,(BYTE *)piVar16,pBVar23,&local_c0);
            }
            else {
              uVar20 = ZSTD_BtFindBestMatch_dictMatchState_4
                                 (local_b0,(BYTE *)piVar16,pBVar23,&local_c0);
            }
            pBVar23 = local_a8;
            if (uVar20 < 4) {
LAB_00362ee0:
              if (local_80 <= piVar16) break;
              piVar16 = (int *)((long)piVar18 + 2);
              uVar7 = ((int)piVar16 - (int)local_68) - local_c8;
              piVar19 = (int *)(local_68 + uVar7);
              if (uVar7 < (uint)local_90) {
                piVar19 = (int *)(local_50 + (uVar7 - local_84));
              }
              if ((uVar7 - (uint)local_90 < 0xfffffffd) && (*piVar19 == *piVar16)) {
                pBVar14 = local_a8;
                if (uVar7 < (uint)local_90) {
                  pBVar14 = local_60;
                }
                sVar9 = ZSTD_count_2segments
                                  ((BYTE *)((long)piVar18 + 6),(BYTE *)(piVar19 + 1),local_a8,
                                   pBVar14,local_70);
                if (sVar9 < 0xfffffffffffffffc) {
                  uVar7 = 0x1f;
                  if ((uint)local_a0 != 0) {
                    for (; (uint)local_a0 >> uVar7 == 0; uVar7 = uVar7 - 1) {
                    }
                  }
                  if ((int)((uVar7 ^ 0x1f) + (int)uVar21 * 4 + -0x1e) < (int)(sVar9 + 4) * 4) {
                    local_a0 = 1;
                    uVar21 = sVar9 + 4;
                    local_98 = piVar16;
                  }
                }
              }
              local_c0 = 999999999;
              if (uVar6 == 6) {
                uVar20 = ZSTD_BtFindBestMatch_dictMatchState_6
                                   (local_b0,(BYTE *)piVar16,pBVar23,&local_c0);
              }
              else if (uVar6 == 5) {
                uVar20 = ZSTD_BtFindBestMatch_dictMatchState_5
                                   (local_b0,(BYTE *)piVar16,pBVar23,&local_c0);
              }
              else {
                uVar20 = ZSTD_BtFindBestMatch_dictMatchState_4
                                   (local_b0,(BYTE *)piVar16,pBVar23,&local_c0);
              }
              if (uVar20 < 4) break;
              uVar7 = 0x1f;
              if ((uint)local_a0 != 0) {
                for (; (uint)local_a0 >> uVar7 == 0; uVar7 = uVar7 - 1) {
                }
              }
              iVar3 = 0x1f;
              if ((uint)local_c0 != 0) {
                for (; (uint)local_c0 >> iVar3 == 0; iVar3 = iVar3 + -1) {
                }
              }
              if ((int)uVar20 * 4 - iVar3 <= (int)((uVar7 ^ 0x1f) + (int)uVar21 * 4 + -0x18)) break;
            }
            else {
              uVar7 = 0x1f;
              if ((uint)local_a0 != 0) {
                for (; (uint)local_a0 >> uVar7 == 0; uVar7 = uVar7 - 1) {
                }
              }
              iVar3 = 0x1f;
              if ((uint)local_c0 != 0) {
                for (; (uint)local_c0 >> iVar3 == 0; iVar3 = iVar3 + -1) {
                }
              }
              if ((int)uVar20 * 4 - iVar3 <= (int)((uVar7 ^ 0x1f) + (int)uVar21 * 4 + -0x1b))
              goto LAB_00362ee0;
            }
            piVar18 = piVar16;
            local_a0 = local_c0;
            uVar21 = uVar20;
            local_98 = piVar18;
          } while (piVar18 < local_80);
        }
        UVar12 = (U32)local_a0;
        piVar18 = local_98;
        if (3 < local_a0) {
          pBVar13 = (BYTE *)((long)local_98 + (-(long)local_68 - local_a0) + -0xfffffffd);
          pBVar14 = local_68;
          pBVar23 = local_70;
          if ((uint)pBVar13 < (uint)local_90) {
            pBVar14 = local_48;
            pBVar23 = local_38;
          }
          if ((src < local_98) && (uVar20 = (ulong)pBVar13 & 0xffffffff, pBVar23 < pBVar14 + uVar20)
             ) {
            pBVar14 = pBVar14 + uVar20;
            do {
              piVar16 = (int *)((long)piVar18 + -1);
              pBVar14 = pBVar14 + -1;
              if ((*(BYTE *)piVar16 != *pBVar14) ||
                 (uVar21 = uVar21 + 1, piVar18 = piVar16, piVar16 <= src)) break;
            } while (pBVar23 < pBVar14);
          }
          local_b4 = local_c8;
          local_c8 = UVar12 - 3;
        }
        uVar20 = (long)piVar18 - (long)src;
        pBVar23 = local_78->lit;
        if (local_58 < piVar18) {
          ZSTD_safecopyLiterals(pBVar23,(BYTE *)src,(BYTE *)piVar18,(BYTE *)local_58);
LAB_003630f6:
          local_78->lit = local_78->lit + uVar20;
          psVar11 = local_78->sequences;
          if (0xffff < uVar20) {
            local_78->longLengthType = ZSTD_llt_literalLength;
            local_78->longLengthPos =
                 (U32)((ulong)((long)psVar11 - (long)local_78->sequencesStart) >> 3);
          }
        }
        else {
          uVar4 = *(undefined8 *)((long)src + 8);
          *(undefined8 *)pBVar23 = *src;
          *(undefined8 *)(pBVar23 + 8) = uVar4;
          pBVar23 = local_78->lit;
          if (0x10 < uVar20) {
            uVar4 = *(undefined8 *)((long)src + 0x18);
            *(undefined8 *)(pBVar23 + 0x10) = *(undefined8 *)((long)src + 0x10);
            *(undefined8 *)(pBVar23 + 0x18) = uVar4;
            if (0x20 < (long)uVar20) {
              lVar17 = 0;
              do {
                puVar1 = (undefined8 *)((long)src + lVar17 + 0x20);
                uVar4 = puVar1[1];
                pBVar14 = pBVar23 + lVar17 + 0x20;
                *(undefined8 *)pBVar14 = *puVar1;
                *(undefined8 *)(pBVar14 + 8) = uVar4;
                puVar1 = (undefined8 *)((long)src + lVar17 + 0x30);
                uVar4 = puVar1[1];
                *(undefined8 *)(pBVar14 + 0x10) = *puVar1;
                *(undefined8 *)(pBVar14 + 0x18) = uVar4;
                lVar17 = lVar17 + 0x20;
              } while (pBVar14 + 0x20 < pBVar23 + uVar20);
            }
            goto LAB_003630f6;
          }
          local_78->lit = pBVar23 + uVar20;
          psVar11 = local_78->sequences;
        }
        psVar5 = local_78;
        pBVar23 = local_a8;
        psVar11->litLength = (U16)uVar20;
        psVar11->offBase = UVar12;
        if (0xffff < uVar21 - 3) {
          local_78->longLengthType = ZSTD_llt_matchLength;
          local_78->longLengthPos =
               (U32)((ulong)((long)psVar11 - (long)local_78->sequencesStart) >> 3);
        }
        psVar11->mlBase = (U16)(uVar21 - 3);
        local_78->sequences = psVar11 + 1;
        if (local_b0->lazySkipping != 0) {
          local_b0->lazySkipping = 0;
        }
        piVar18 = (int *)((long)piVar18 + uVar21);
        src = piVar18;
        UVar12 = local_b4;
        UVar8 = local_b4;
        if (piVar18 <= local_80) {
          do {
            UVar22 = UVar8;
            UVar8 = local_c8;
            uVar7 = ((int)piVar18 - (int)local_68) - UVar22;
            uVar15 = (uint)local_90;
            pBVar14 = local_68;
            if (uVar7 < uVar15) {
              pBVar14 = local_48;
            }
            src = piVar18;
            UVar12 = UVar22;
            local_c8 = UVar8;
            if ((0xfffffffc < uVar7 - uVar15) || (*(int *)(pBVar14 + uVar7) != *piVar18)) break;
            pBVar13 = pBVar23;
            if (uVar7 < uVar15) {
              pBVar13 = local_60;
            }
            sVar9 = ZSTD_count_2segments
                              ((BYTE *)(piVar18 + 1),(BYTE *)((long)(pBVar14 + uVar7) + 4),pBVar23,
                               pBVar13,local_70);
            pBVar14 = psVar5->lit;
            if (local_58 < piVar18) {
              ZSTD_safecopyLiterals(pBVar14,(BYTE *)piVar18,(BYTE *)piVar18,(BYTE *)local_58);
            }
            else {
              uVar4 = *(undefined8 *)(piVar18 + 2);
              *(undefined8 *)pBVar14 = *(undefined8 *)piVar18;
              *(undefined8 *)(pBVar14 + 8) = uVar4;
            }
            psVar11 = psVar5->sequences;
            psVar11->litLength = 0;
            psVar11->offBase = 1;
            if (0xffff < sVar9 + 1) {
              psVar5->longLengthType = ZSTD_llt_matchLength;
              psVar5->longLengthPos =
                   (U32)((ulong)((long)psVar11 - (long)psVar5->sequencesStart) >> 3);
            }
            psVar11->mlBase = (U16)(sVar9 + 1);
            psVar5->sequences = psVar11 + 1;
            piVar18 = (int *)((long)piVar18 + sVar9 + 4);
            src = piVar18;
            UVar12 = UVar8;
            local_c8 = UVar22;
          } while (piVar18 <= local_80);
        }
      }
      local_b4 = UVar12;
    } while (piVar18 < local_80);
  }
  *local_40 = local_c8;
  local_40[1] = local_b4;
  return (long)pBVar23 - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_btlazy2_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_binaryTree, 2, ZSTD_dictMatchState);
}